

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pk_decrypt.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  size_t len;
  char *pers;
  uchar buf [512];
  uchar result [1024];
  undefined1 local_5b0 [8];
  mbedtls_ctr_drbg_context ctr_drbg;
  mbedtls_entropy_context entropy;
  mbedtls_pk_context pk;
  size_t olen;
  size_t i;
  undefined1 local_28 [4];
  int exit_code;
  int c;
  int ret;
  FILE *f;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  exit_code = 1;
  i._4_4_ = 1;
  pk.pk_ctx = (void *)0x0;
  f = (FILE *)argv;
  argv_local._0_4_ = argc;
  mbedtls_pk_init((mbedtls_pk_context *)&entropy.source[0x13].strong);
  mbedtls_entropy_init((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  mbedtls_ctr_drbg_init((mbedtls_ctr_drbg_context *)local_5b0);
  memset(buf + 0x1f8,0,0x400);
  if ((int)argv_local == 2) {
    printf("\n  . Seeding the random number generator...");
    fflush(_stdout);
    len = strlen("mbedtls_pk_decrypt");
    exit_code = mbedtls_ctr_drbg_seed
                          ((mbedtls_ctr_drbg_context *)local_5b0,mbedtls_entropy_func,
                           &ctr_drbg.p_entropy,(uchar *)"mbedtls_pk_decrypt",len);
    if (exit_code == 0) {
      printf("\n  . Reading private key from \'%s\'",f->_IO_read_ptr);
      fflush(_stdout);
      exit_code = mbedtls_pk_parse_keyfile
                            ((mbedtls_pk_context *)&entropy.source[0x13].strong,f->_IO_read_ptr,
                             anon_var_dwarf_f91b + 9);
      if (exit_code == 0) {
        _c = fopen("result-enc.txt","rb");
        if (_c == (FILE *)0x0) {
          printf("\n  ! Could not open %s\n\n","result-enc.txt");
          exit_code = 1;
        }
        else {
          olen = 0;
          while (iVar1 = __isoc99_fscanf(_c,"%02X",local_28), 0 < iVar1 && olen < 0x200) {
            buf[olen - 8] = local_28[0];
            olen = olen + 1;
          }
          fclose(_c);
          printf("\n  . Decrypting the encrypted data");
          fflush(_stdout);
          exit_code = mbedtls_pk_decrypt((mbedtls_pk_context *)&entropy.source[0x13].strong,
                                         (uchar *)&pers,olen,buf + 0x1f8,(size_t *)&pk.pk_ctx,0x400,
                                         mbedtls_ctr_drbg_random,local_5b0);
          if (exit_code == 0) {
            printf("\n  . OK\n\n");
            printf("The decrypted result is: \'%s\'\n\n",buf + 0x1f8);
            i._4_4_ = 0;
          }
          else {
            printf(" failed\n  ! mbedtls_pk_decrypt returned -0x%04x\n",(ulong)(uint)-exit_code);
          }
        }
      }
      else {
        printf(" failed\n  ! mbedtls_pk_parse_keyfile returned -0x%04x\n",(ulong)(uint)-exit_code);
      }
    }
    else {
      printf(" failed\n  ! mbedtls_ctr_drbg_seed returned -0x%04x\n",(ulong)(uint)-exit_code);
    }
  }
  else {
    printf("usage: mbedtls_pk_decrypt <key_file>\n");
  }
  mbedtls_pk_free((mbedtls_pk_context *)&entropy.source[0x13].strong);
  mbedtls_entropy_free((mbedtls_entropy_context *)&ctr_drbg.p_entropy);
  mbedtls_ctr_drbg_free((mbedtls_ctr_drbg_context *)local_5b0);
  if (i._4_4_ != 0) {
    mbedtls_strerror(exit_code,(char *)&pers,0x200);
    printf("  !  Last error was: %s\n",&pers);
  }
  return i._4_4_;
}

Assistant:

int main( int argc, char *argv[] )
{
    FILE *f;
    int ret = 1, c;
    int exit_code = MBEDTLS_EXIT_FAILURE;
    size_t i, olen = 0;
    mbedtls_pk_context pk;
    mbedtls_entropy_context entropy;
    mbedtls_ctr_drbg_context ctr_drbg;
    unsigned char result[1024];
    unsigned char buf[512];
    const char *pers = "mbedtls_pk_decrypt";
    ((void) argv);

    mbedtls_pk_init( &pk );
    mbedtls_entropy_init( &entropy );
    mbedtls_ctr_drbg_init( &ctr_drbg );

    memset(result, 0, sizeof( result ) );

    if( argc != 2 )
    {
        mbedtls_printf( "usage: mbedtls_pk_decrypt <key_file>\n" );

#if defined(_WIN32)
        mbedtls_printf( "\n" );
#endif

        goto exit;
    }

    mbedtls_printf( "\n  . Seeding the random number generator..." );
    fflush( stdout );

    if( ( ret = mbedtls_ctr_drbg_seed( &ctr_drbg, mbedtls_entropy_func,
                                       &entropy, (const unsigned char *) pers,
                                       strlen( pers ) ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_ctr_drbg_seed returned -0x%04x\n",
                        -ret );
        goto exit;
    }

    mbedtls_printf( "\n  . Reading private key from '%s'", argv[1] );
    fflush( stdout );

    if( ( ret = mbedtls_pk_parse_keyfile( &pk, argv[1], "" ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_pk_parse_keyfile returned -0x%04x\n", -ret );
        goto exit;
    }

    /*
     * Extract the RSA encrypted value from the text file
     */
    if( ( f = fopen( "result-enc.txt", "rb" ) ) == NULL )
    {
        mbedtls_printf( "\n  ! Could not open %s\n\n", "result-enc.txt" );
        ret = 1;
        goto exit;
    }

    i = 0;
    while( fscanf( f, "%02X", &c ) > 0 &&
           i < (int) sizeof( buf ) )
    {
        buf[i++] = (unsigned char) c;
    }

    fclose( f );

    /*
     * Decrypt the encrypted RSA data and print the result.
     */
    mbedtls_printf( "\n  . Decrypting the encrypted data" );
    fflush( stdout );

    if( ( ret = mbedtls_pk_decrypt( &pk, buf, i, result, &olen, sizeof(result),
                            mbedtls_ctr_drbg_random, &ctr_drbg ) ) != 0 )
    {
        mbedtls_printf( " failed\n  ! mbedtls_pk_decrypt returned -0x%04x\n",
                        -ret );
        goto exit;
    }

    mbedtls_printf( "\n  . OK\n\n" );

    mbedtls_printf( "The decrypted result is: '%s'\n\n", result );

    exit_code = MBEDTLS_EXIT_SUCCESS;

exit:

    mbedtls_pk_free( &pk );
    mbedtls_entropy_free( &entropy );
    mbedtls_ctr_drbg_free( &ctr_drbg );

#if defined(MBEDTLS_ERROR_C)
    if( exit_code != MBEDTLS_EXIT_SUCCESS )
    {
        mbedtls_strerror( ret, (char *) buf, sizeof( buf ) );
        mbedtls_printf( "  !  Last error was: %s\n", buf );
    }
#endif

#if defined(_WIN32)
    mbedtls_printf( "  + Press Enter to exit this program.\n" );
    fflush( stdout ); getchar();
#endif

    return( exit_code );
}